

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O2

void vscode_unpack(int64_t i,PackedInteger *pi)

{
  undefined1 auVar1 [16];
  
  auVar1 = vpbroadcastd_avx512vl();
  auVar1 = vpsrlvd_avx2(auVar1,_DAT_00105790);
  auVar1 = vpand_avx(auVar1,_DAT_001057a0);
  pi->x8[0] = (uint)(i & 0xff000000ffU);
  *(long *)(pi->x8 + 1) = auVar1._0_8_;
  pi->x8[3] = (uint)((ulong)i >> 0x18) & 0xff;
  pi->x8[4] = (uint)((i & 0xff000000ffU) >> 0x20);
  pi->depth = (uint)((ulong)i >> 0x28) & 0xff;
  pi->vartype = (ushort)((ulong)i >> 0x30) & 0xf;
  return;
}

Assistant:

void vscode_unpack(int64_t i, PackedInteger *pi) {
  int64_t mask = 0xFF;
  pi->x8[0] = (unsigned int)(i & mask); mask <<= 8;
  pi->x8[1] = (unsigned int)((i & mask) >> 8); mask <<= 8;
  pi->x8[2] = (unsigned int)((i & mask) >> 16); mask <<= 8;
  pi->x8[3] = (unsigned int)((i & mask) >> 24); mask <<= 8;
  pi->x8[4] = (unsigned int)((i & mask) >> 32); mask <<= 8;
  pi->depth = (unsigned int)((i & mask) >> 40); mask <<= 8;
  pi->vartype = (unsigned int)(((i & mask) >> 48) & 0x0F);
}